

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

void __thiscall
VulkanHppGenerator::addMissingFlagBits
          (VulkanHppGenerator *this,
          vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
          *requireData,string *requiredBy)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_> *this_00;
  pointer ppVar2;
  pointer ppVar3;
  iterator __first;
  iterator __last;
  vector<VulkanHppGenerator::NameLine,std::allocator<VulkanHppGenerator::NameLine>> *this_01;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>,_bool>
  pVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>,_bool>
  pVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_450;
  __normal_iterator<VulkanHppGenerator::NameLine_*,_std::vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>_>
  local_3c0;
  const_iterator local_3b8;
  value_type local_3b0;
  _Base_ptr local_380;
  _Base_ptr local_378;
  undefined1 local_370;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_362;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_361;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  undefined1 local_338 [24];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_320;
  undefined4 local_2f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>
  local_2e8;
  _Base_ptr local_288;
  undefined1 local_280;
  undefined1 local_278 [80];
  bool local_228;
  vector<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>
  local_220;
  vector<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>
  local_208;
  int local_1f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>
  local_1e0;
  _Self local_130;
  _Self local_128;
  iterator enumIt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_c0 [8];
  string flagBits;
  size_t pos;
  _Self local_80;
  iterator bitmaskIt;
  NameLine *type;
  iterator __end2;
  iterator __begin2;
  vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_> *__range2;
  vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_> newTypes;
  RequireData *require;
  iterator __end1;
  iterator __begin1;
  vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
  *__range1;
  string *requiredBy_local;
  vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
  *requireData_local;
  VulkanHppGenerator *this_local;
  
  __end1 = std::
           vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
           ::begin(requireData);
  require = (RequireData *)
            std::
            vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
            ::end(requireData);
  do {
    bVar1 = __gnu_cxx::
            operator==<VulkanHppGenerator::RequireData_*,_std::vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>_>
                      (&__end1,(__normal_iterator<VulkanHppGenerator::RequireData_*,_std::vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>_>
                                *)&require);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    newTypes.
    super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<VulkanHppGenerator::RequireData_*,_std::vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>_>
                  ::operator*(&__end1);
    std::vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>::vector
              ((vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
                *)&__range2);
    this_00 = (vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_> *
              )((long)&newTypes.
                       super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage[4].name.field_2 + 8);
    __end2 = std::
             vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>::
             begin(this_00);
    type = (NameLine *)
           std::vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
           ::end(this_00);
    while (bVar1 = __gnu_cxx::
                   operator==<VulkanHppGenerator::NameLine_*,_std::vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>_>
                             (&__end2,(__normal_iterator<VulkanHppGenerator::NameLine_*,_std::vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>_>
                                       *)&type), ((bVar1 ^ 0xffU) & 1) != 0) {
      bitmaskIt._M_node =
           (_Base_ptr)
           __gnu_cxx::
           __normal_iterator<VulkanHppGenerator::NameLine_*,_std::vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>_>
           ::operator*(&__end2);
      local_80._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::BitmaskData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::BitmaskData>_>_>
           ::find(&this->m_bitmasks,(key_type *)bitmaskIt._M_node);
      pos = (size_t)std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::BitmaskData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::BitmaskData>_>_>
                    ::end(&this->m_bitmasks);
      bVar1 = std::operator==(&local_80,(_Self *)&pos);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        ppVar2 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::BitmaskData>_>
                 ::operator->(&local_80);
        bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty(&(ppVar2->second).require);
        if (bVar1) {
          ppVar2 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::BitmaskData>_>
                   ::operator->(&local_80);
          flagBits.field_2._8_8_ =
               std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                         (&ppVar2->first,"Flags",0);
          if (flagBits.field_2._8_8_ == 0xffffffffffffffff) {
            __assert_fail("pos != std::string::npos",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                          ,0x259,
                          "void VulkanHppGenerator::addMissingFlagBits(std::vector<RequireData> &, const std::string &)"
                         );
          }
          ppVar2 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::BitmaskData>_>
                   ::operator->(&local_80);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_100,&ppVar2->first,0,flagBits.field_2._8_8_ + 4);
          std::operator+(&local_e0,&local_100,"Bit");
          ppVar2 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::BitmaskData>_>
                   ::operator->(&local_80);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&enumIt,
                     &ppVar2->first,flagBits.field_2._8_8_ + 4,0xffffffffffffffff);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c0,&local_e0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &enumIt);
          std::__cxx11::string::~string((string *)&enumIt);
          std::__cxx11::string::~string((string *)&local_e0);
          std::__cxx11::string::~string((string *)&local_100);
          ppVar2 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::BitmaskData>_>
                   ::operator->(&local_80);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&(ppVar2->second).require,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
          local_128._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
               ::find(&this->m_enums,(key_type *)local_c0);
          local_130._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
               ::end(&this->m_enums);
          bVar1 = std::operator==(&local_128,&local_130);
          if (bVar1) {
            local_278._32_8_ = (_Base_ptr)0x0;
            local_278._40_8_ = 0;
            local_278._16_8_ = (_Base_ptr)0x0;
            local_278._24_8_ = (_Base_ptr)0x0;
            local_278._0_8_ = 0;
            local_278._8_8_ = 0;
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)local_278);
            std::__cxx11::string::string((string *)(local_278 + 0x30));
            local_228 = true;
            local_220.
            super__Vector_base<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_220.
            super__Vector_base<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_220.
            super__Vector_base<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::
            vector<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>
            ::vector(&local_220);
            local_208.
            super__Vector_base<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_208.
            super__Vector_base<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_208.
            super__Vector_base<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::
            vector<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>
            ::vector(&local_208);
            local_1f0 = 0;
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>
            ::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_VulkanHppGenerator::EnumData,_true>
                      (&local_1e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0
                       ,(EnumData *)local_278);
            pVar4 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
                    ::insert(&this->m_enums,&local_1e0);
            local_288 = (_Base_ptr)pVar4.first._M_node;
            local_280 = pVar4.second;
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>
            ::~pair(&local_1e0);
            EnumData::~EnumData((EnumData *)local_278);
            bVar1 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
                    ::contains(&this->m_types,(key_type *)local_c0);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              __assert_fail("!m_types.contains( flagBits )",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                            ,0x265,
                            "void VulkanHppGenerator::addMissingFlagBits(std::vector<RequireData> &, const std::string &)"
                           );
            }
            local_338._16_4_ = 0;
            local_360 = &local_358;
            std::__cxx11::string::string((string *)local_360,requiredBy);
            local_338._0_8_ = &local_358;
            local_338._8_8_ = 1;
            std::
            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::allocator(&local_362);
            __l._M_len = local_338._8_8_;
            __l._M_array = (iterator)local_338._0_8_;
            std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::set(&local_320,__l,&local_361,&local_362);
            local_2f0 = 0;
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>
            ::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TypeData,_true>
                      (&local_2e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0
                       ,(TypeData *)(local_338 + 0x10));
            pVar5 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
                    ::insert(&this->m_types,&local_2e8);
            local_378 = (_Base_ptr)pVar5.first._M_node;
            local_370 = pVar5.second;
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>
            ::~pair(&local_2e8);
            TypeData::~TypeData((TypeData *)(local_338 + 0x10));
            std::
            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~allocator(&local_362);
            local_450 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_338;
            do {
              local_450 = local_450 + -1;
              std::__cxx11::string::~string((string *)local_450);
            } while (local_450 != &local_358);
          }
          else {
            bVar1 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
                    ::contains(&this->m_types,(key_type *)local_c0);
            if (!bVar1) {
              __assert_fail("m_types.contains( flagBits )",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                            ,0x26a,
                            "void VulkanHppGenerator::addMissingFlagBits(std::vector<RequireData> &, const std::string &)"
                           );
            }
            ppVar3 = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>
                     ::operator->(&local_128);
            (ppVar3->second).isBitmask = true;
          }
          std::__cxx11::string::~string((string *)local_c0);
        }
        local_380 = local_80._M_node;
        bVar1 = std::ranges::__none_of_fn::
                operator()<std::vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>_&,_std::identity,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_KhronosGroup[P]Vulkan_Hpp_VulkanHppGenerator_cpp:622:51)>
                          ((__none_of_fn *)&std::ranges::none_of,
                           (undefined1 *)
                           ((long)&newTypes.
                                   super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage[4].name.
                                   field_2 + 8),local_80._M_node);
        if (bVar1) {
          ppVar2 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::BitmaskData>_>
                   ::operator->(&local_80);
          std::__cxx11::string::string((string *)&local_3b0,&(ppVar2->second).require);
          ppVar2 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::BitmaskData>_>
                   ::operator->(&local_80);
          local_3b0.xmlLine = (ppVar2->second).xmlLine;
          std::vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>::
          push_back((vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
                     *)&__range2,&local_3b0);
          NameLine::~NameLine(&local_3b0);
        }
      }
      __gnu_cxx::
      __normal_iterator<VulkanHppGenerator::NameLine_*,_std::vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>_>
      ::operator++(&__end2);
    }
    this_01 = (vector<VulkanHppGenerator::NameLine,std::allocator<VulkanHppGenerator::NameLine>> *)
              (newTypes.
               super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage[4].name.field_2._M_local_buf + 8);
    local_3c0._M_current =
         (NameLine *)
         std::vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>::
         end((vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_> *)
             this_01);
    __gnu_cxx::
    __normal_iterator<VulkanHppGenerator::NameLine_const*,std::vector<VulkanHppGenerator::NameLine,std::allocator<VulkanHppGenerator::NameLine>>>
    ::__normal_iterator<VulkanHppGenerator::NameLine*>
              ((__normal_iterator<VulkanHppGenerator::NameLine_const*,std::vector<VulkanHppGenerator::NameLine,std::allocator<VulkanHppGenerator::NameLine>>>
                *)&local_3b8,&local_3c0);
    __first = std::
              vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>::
              begin((vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
                     *)&__range2);
    __last = std::
             vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>::
             end((vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
                  *)&__range2);
    std::vector<VulkanHppGenerator::NameLine,std::allocator<VulkanHppGenerator::NameLine>>::
    insert<__gnu_cxx::__normal_iterator<VulkanHppGenerator::NameLine*,std::vector<VulkanHppGenerator::NameLine,std::allocator<VulkanHppGenerator::NameLine>>>,void>
              (this_01,local_3b8,
               (__normal_iterator<VulkanHppGenerator::NameLine_*,_std::vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>_>
                )__first._M_current,
               (__normal_iterator<VulkanHppGenerator::NameLine_*,_std::vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>_>
                )__last._M_current);
    std::vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>::
    ~vector((vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_> *)
            &__range2);
    __gnu_cxx::
    __normal_iterator<VulkanHppGenerator::RequireData_*,_std::vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void VulkanHppGenerator::addMissingFlagBits( std::vector<RequireData> & requireData, std::string const & requiredBy )
{
  for ( auto & require : requireData )
  {
    std::vector<NameLine> newTypes;
    for ( auto const & type : require.types )
    {
      auto bitmaskIt = m_bitmasks.find( type.name );
      if ( bitmaskIt != m_bitmasks.end() )
      {
        if ( bitmaskIt->second.require.empty() )
        {
          // generate the flagBits enum name out of the bitmask name: VkFooFlagsXXX -> VkFooFlagBitsXXX
          const size_t pos = bitmaskIt->first.find( "Flags" );
          assert( pos != std::string::npos );
          std::string flagBits = bitmaskIt->first.substr( 0, pos + 4 ) + "Bit" + bitmaskIt->first.substr( pos + 4 );

          bitmaskIt->second.require = flagBits;

          // some flagsBits are specified but never listed as required for any flags!
          // so, even if this bitmask has no enum listed as required, it might still already exist in the enums list
          auto enumIt = m_enums.find( flagBits );
          if ( enumIt == m_enums.end() )
          {
            m_enums.insert( { flagBits, EnumData{ .isBitmask = true, .xmlLine = 0 } } );

            assert( !m_types.contains( flagBits ) );
            m_types.insert( { flagBits, TypeData{ TypeCategory::Bitmask, { requiredBy }, 0 } } );
          }
          else
          {
            assert( m_types.contains( flagBits ) );
            enumIt->second.isBitmask = true;
          }
        }
        if ( std::ranges::none_of( require.types, [bitmaskIt]( auto const & requireType ) { return requireType.name == bitmaskIt->second.require; } ) )
        {
          // this bitmask requires a flags type that is not listed in here, so add it
          newTypes.push_back( { bitmaskIt->second.require, bitmaskIt->second.xmlLine } );
        }
      }
    }
    // add all the newly created flagBits types to the require list as if they had been part of the vk.xml!
    require.types.insert( require.types.end(), newTypes.begin(), newTypes.end() );
  }
}